

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtBase.cpp
# Opt level: O2

void __thiscall axl::io::ShmtBase::closeImpl(ShmtBase *this)

{
  int in_ESI;
  
  sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::close
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&this->m_file,in_ESI);
  sl::Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>::close
            ((Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_> *)
             &this->m_readSemaphore,in_ESI);
  sl::Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>::close
            ((Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_> *)
             &this->m_writeSemaphore,in_ESI);
  this->m_hdr = (ShmtFileHdr *)0x0;
  this->m_data = (char *)0x0;
  return;
}

Assistant:

void
ShmtBase::closeImpl() {
	m_file.close();
	m_readSemaphore.close();
	m_writeSemaphore.close();
	m_hdr = NULL;
	m_data = NULL;
}